

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O2

unsigned_long query_int<unsigned_long,char_const(&)[19]>(char (*prompt) [19])

{
  unsigned_long res;
  string read_data;
  istringstream converter;
  
  query_str<char_const(&)[19]>(&read_data,prompt);
  std::__cxx11::istringstream::istringstream((istringstream *)&converter,(string *)&read_data,_S_in)
  ;
  std::istream::_M_extract<unsigned_long>((ulong *)&converter);
  std::__cxx11::istringstream::~istringstream((istringstream *)&converter);
  std::__cxx11::string::~string((string *)&read_data);
  return res;
}

Assistant:

Integer query_int(T && prompt)
{
    const std::string read_data = query_str(std::forward<T>(prompt));

    std::istringstream converter(read_data);

    Integer res;

    converter >> res;

    return res;
}